

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.cpp
# Opt level: O0

Symbol * __thiscall ScopeNode::resolve(ScopeNode *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  ScopeNode *this_00;
  scope_not_found *this_01;
  ScopeNode *enclosing_scope;
  _Self local_28;
  iterator it;
  string *name_local;
  ScopeNode *this_local;
  
  it._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>_>
       ::find(&this->symbols_,name);
  enclosing_scope =
       (ScopeNode *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>_>
       ::end(&this->symbols_);
  bVar1 = std::operator!=(&local_28,(_Self *)&enclosing_scope);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>
             ::operator->(&local_28);
    this_local = (ScopeNode *)&ppVar2->second;
  }
  else {
    this_00 = get_enclosing_scope(this);
    if (this_00 == (ScopeNode *)0x0) {
      this_01 = (scope_not_found *)__cxa_allocate_exception(8);
      memset(this_01,0,8);
      scope_not_found::scope_not_found(this_01);
      __cxa_throw(this_01,&scope_not_found::typeinfo,scope_not_found::~scope_not_found);
    }
    this_local = (ScopeNode *)resolve(this_00,(string *)it._M_node);
  }
  return (Symbol *)this_local;
}

Assistant:

Symbol &ScopeNode::resolve(const std::string &name) {
    std::map<std::string, Symbol>::iterator it = symbols_.find(name);
    if (it != symbols_.end()) {
        return it->second;
    } else {
        ScopeNode *enclosing_scope = get_enclosing_scope();
        if (enclosing_scope) {
            return enclosing_scope->resolve(name);
        } else {
            throw scope_not_found();
        }
    }
}